

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O3

adios2_error adios2_engine_get_metadata(adios2_engine *engine,char **md,size_t *size)

{
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"for const adios2_engine, in call to adios2_get_metadata","");
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (**(code **)(*(long *)engine + 0x10))(engine,md,size);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_engine_get_metadata(adios2_engine *engine, char **md, size_t *size)
{
    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for const adios2_engine, in call to adios2_get_metadata");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        engineCpp->GetMetadata(md, size);
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_get_metadata"));
    }
}